

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall Catch::Session::Session(Session *this)

{
  bool bVar1;
  int iVar2;
  IRegistryHub *pIVar3;
  undefined4 extraout_var;
  Context *this_00;
  Config *config;
  IStream *pIVar4;
  undefined4 extraout_var_00;
  ostream *poVar5;
  IStream *in_RDI;
  undefined1 auVar6 [12];
  exception *ex;
  exception_ptr *ex_ptr;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::__exception_ptr::exception_ptr,_std::allocator<std::__exception_ptr::exception_ptr>_>
  *__range2;
  ColourGuard guard;
  unique_ptr<Catch::ColourImpl> colourImpl;
  unique_ptr<Catch::IStream> errStream;
  vector<std::__exception_ptr::exception_ptr,_std::allocator<std::__exception_ptr::exception_ptr>_>
  *exceptions;
  ConfigData *in_stack_00002168;
  Parser *in_stack_fffffffffffffda8;
  undefined4 in_stack_fffffffffffffdb0;
  Code in_stack_fffffffffffffdb4;
  ColourImpl *in_stack_fffffffffffffdb8;
  Parser *in_stack_fffffffffffffdc0;
  string *in_stack_fffffffffffffdd0;
  exception_ptr eVar7;
  allocator<char> *in_stack_fffffffffffffde0;
  char *in_stack_fffffffffffffde8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  ColourMode colourSelection;
  string *in_stack_fffffffffffffe68;
  undefined1 local_d0 [8];
  reference local_c8;
  exception_ptr *local_c0;
  __normal_iterator<const_std::__exception_ptr::exception_ptr_*,_std::vector<std::__exception_ptr::exception_ptr,_std::allocator<std::__exception_ptr::exception_ptr>_>_>
  local_b8;
  vector<std::__exception_ptr::exception_ptr,_std::allocator<std::__exception_ptr::exception_ptr>_>
  *local_b0;
  unique_ptr<Catch::ColourImpl> local_98;
  undefined1 local_89 [33];
  unique_ptr<Catch::IStream> local_68;
  vector<std::__exception_ptr::exception_ptr,_std::allocator<std::__exception_ptr::exception_ptr>_>
  *local_60;
  SourceLineInfo local_58 [4];
  undefined4 local_14;
  undefined8 local_10;
  
  pIVar4 = in_RDI;
  Clara::Parser::Parser(in_stack_fffffffffffffdc0);
  colourSelection = (ColourMode)((ulong)(pIVar4 + 0xc) >> 0x38);
  ConfigData::ConfigData
            ((ConfigData *)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0));
  Detail::unique_ptr<Catch::Config>::unique_ptr
            ((unique_ptr<Catch::Config> *)(in_RDI + 0x2e),(nullptr_t)0x0);
  *(undefined1 *)&in_RDI[0x2f]._vptr_IStream = 0;
  if ((Session::alreadyInstantiated & 1U) != 0) {
    ReusableStringStream::ReusableStringStream
              ((ReusableStringStream *)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0)
              );
    SourceLineInfo::SourceLineInfo
              (local_58,
               "/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/third_party/catch2v3_amalgamated/catch_amalgamated.cpp"
               ,0x500);
    ReusableStringStream::operator<<
              ((ReusableStringStream *)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0)
               ,(SourceLineInfo *)in_stack_fffffffffffffda8);
    ReusableStringStream::operator<<
              ((ReusableStringStream *)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0)
               ,(char (*) [26])in_stack_fffffffffffffda8);
    ReusableStringStream::operator<<
              ((ReusableStringStream *)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0)
               ,(char (*) [53])in_stack_fffffffffffffda8);
    ReusableStringStream::str_abi_cxx11_((ReusableStringStream *)in_stack_fffffffffffffda8);
    throw_logic_error(in_stack_fffffffffffffdd0);
  }
  pIVar3 = getRegistryHub();
  iVar2 = (*pIVar3->_vptr_IRegistryHub[6])();
  local_60 = StartupExceptionRegistry::getExceptions
                       ((StartupExceptionRegistry *)CONCAT44(extraout_var,iVar2));
  bVar1 = std::
          vector<std::__exception_ptr::exception_ptr,_std::allocator<std::__exception_ptr::exception_ptr>_>
          ::empty((vector<std::__exception_ptr::exception_ptr,_std::allocator<std::__exception_ptr::exception_ptr>_>
                   *)in_stack_fffffffffffffdc0);
  if (!bVar1) {
    Session::config((Session *)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0));
    this_00 = getCurrentMutableContext();
    config = Detail::unique_ptr<Catch::Config>::get((unique_ptr<Catch::Config> *)(in_RDI + 0x2e));
    Context::setConfig(this_00,&config->super_IConfig);
    *(undefined1 *)&in_RDI[0x2f]._vptr_IStream = 1;
    this_01 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_89;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (this_01,in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
    makeStream(in_stack_fffffffffffffe68);
    std::__cxx11::string::~string((string *)(local_89 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_89);
    Detail::unique_ptr<Catch::IStream>::get(&local_68);
    makeColourImpl(colourSelection,pIVar4);
    Detail::unique_ptr<Catch::ColourImpl>::operator->(&local_98);
    ColourImpl::guardColour(in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb4);
    pIVar4 = Detail::unique_ptr<Catch::IStream>::operator->(&local_68);
    iVar2 = (*pIVar4->_vptr_IStream[2])();
    poVar5 = std::operator<<((ostream *)CONCAT44(extraout_var_00,iVar2),
                             "Errors occurred during startup!");
    std::operator<<(poVar5,'\n');
    local_b0 = local_60;
    local_b8._M_current =
         (exception_ptr *)
         std::
         vector<std::__exception_ptr::exception_ptr,_std::allocator<std::__exception_ptr::exception_ptr>_>
         ::begin((vector<std::__exception_ptr::exception_ptr,_std::allocator<std::__exception_ptr::exception_ptr>_>
                  *)in_stack_fffffffffffffda8);
    local_c0 = (exception_ptr *)
               std::
               vector<std::__exception_ptr::exception_ptr,_std::allocator<std::__exception_ptr::exception_ptr>_>
               ::end((vector<std::__exception_ptr::exception_ptr,_std::allocator<std::__exception_ptr::exception_ptr>_>
                      *)in_stack_fffffffffffffda8);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_std::__exception_ptr::exception_ptr_*,_std::vector<std::__exception_ptr::exception_ptr,_std::allocator<std::__exception_ptr::exception_ptr>_>_>
                        *)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),
                       (__normal_iterator<const_std::__exception_ptr::exception_ptr_*,_std::vector<std::__exception_ptr::exception_ptr,_std::allocator<std::__exception_ptr::exception_ptr>_>_>
                        *)in_stack_fffffffffffffda8);
    if (bVar1) {
      local_c8 = __gnu_cxx::
                 __normal_iterator<const_std::__exception_ptr::exception_ptr_*,_std::vector<std::__exception_ptr::exception_ptr,_std::allocator<std::__exception_ptr::exception_ptr>_>_>
                 ::operator*(&local_b8);
      eVar7._M_exception_object = local_d0;
      std::__exception_ptr::exception_ptr::exception_ptr
                ((exception_ptr *)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),
                 (exception_ptr *)in_stack_fffffffffffffda8);
      auVar6 = std::rethrow_exception(eVar7);
      local_14 = auVar6._8_4_;
      local_10 = auVar6._0_8_;
      std::allocator<char>::~allocator((allocator<char> *)local_89);
      Detail::unique_ptr<Catch::Config>::~unique_ptr
                ((unique_ptr<Catch::Config> *)
                 CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0));
      ConfigData::~ConfigData
                ((ConfigData *)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0));
      Clara::Parser::~Parser
                ((Parser *)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0));
      _Unwind_Resume(local_10);
    }
    ColourImpl::ColourGuard::~ColourGuard
              ((ColourGuard *)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0));
    Detail::unique_ptr<Catch::ColourImpl>::~unique_ptr
              ((unique_ptr<Catch::ColourImpl> *)
               CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0));
    Detail::unique_ptr<Catch::IStream>::~unique_ptr
              ((unique_ptr<Catch::IStream> *)
               CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0));
  }
  Session::alreadyInstantiated = true;
  makeCommandLineParser(in_stack_00002168);
  Clara::Parser::operator=
            ((Parser *)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),
             in_stack_fffffffffffffda8);
  Clara::Parser::~Parser((Parser *)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0));
  return;
}

Assistant:

Session::Session() {
        static bool alreadyInstantiated = false;
        if( alreadyInstantiated ) {
            CATCH_TRY { CATCH_INTERNAL_ERROR( "Only one instance of Catch::Session can ever be used" ); }
            CATCH_CATCH_ALL { getMutableRegistryHub().registerStartupException(); }